

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  uint val;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  xmlChar *pxVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  byte *local_58;
  int l;
  byte *local_48;
  xmlParserInputPtr local_40;
  xmlChar **local_38;
  
  local_48 = (byte *)0x0;
  bVar1 = *ctxt->input->cur;
  uVar7 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    uVar7 = 0x27;
  }
  local_58 = (byte *)(*xmlMallocAtomic)(100);
  if (local_58 == (byte *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_ENTITY_VALUE;
  local_40 = ctxt->input;
  if (((ctxt->progressive != 0) || (0xf9 < (long)local_40->end - (long)local_40->cur)) ||
     (xmlGROW(ctxt), ctxt->instate != XML_PARSER_EOF)) {
    local_38 = orig;
    xmlNextChar(ctxt);
    iVar4 = 0;
    iVar8 = 100;
    do {
      val = xmlCurrentChar(ctxt,&l);
      do {
        uVar9 = val;
        if ((int)val < 0x100) {
          if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
          goto LAB_0015a092;
LAB_0015a1c5:
          local_58[iVar4] = 0;
          if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015a279;
          if (uVar9 == uVar7) {
            xmlNextChar(ctxt);
            local_48 = local_58;
            goto LAB_0015a1fc;
          }
          xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_FINISHED,(char *)0x0);
          goto LAB_0015a279;
        }
        if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) goto LAB_0015a1c5;
LAB_0015a092:
        if (((val == uVar7) && (uVar9 = uVar7, ctxt->input == local_40)) ||
           (uVar9 = val, ctxt->instate == XML_PARSER_EOF)) goto LAB_0015a1c5;
        pbVar5 = local_58;
        if (iVar8 <= iVar4 + 5) {
          iVar8 = iVar8 * 2;
          pbVar5 = (byte *)(*xmlRealloc)(local_58,(long)iVar8);
          if (pbVar5 == (byte *)0x0) {
            pxVar6 = (xmlChar *)0x0;
            xmlErrMemory(ctxt,(char *)0x0);
            goto LAB_0015a2a5;
          }
        }
        if (l == 1) {
          pbVar5[iVar4] = (byte)val;
          iVar4 = iVar4 + 1;
        }
        else {
          iVar3 = xmlCopyCharMultiByte(pbVar5 + iVar4,val);
          iVar4 = iVar3 + iVar4;
        }
        pxVar2 = ctxt->input;
        if (*pxVar2->cur == '\n') {
          pxVar2->line = pxVar2->line + 1;
          pxVar2->col = 1;
        }
        else {
          pxVar2->col = pxVar2->col + 1;
        }
        pxVar6 = pxVar2->cur + l;
        pxVar2->cur = pxVar6;
        if ((ctxt->progressive == 0) && ((long)pxVar2->end - (long)pxVar6 < 0xfa)) {
          xmlGROW(ctxt);
        }
        val = xmlCurrentChar(ctxt,&l);
        local_58 = pbVar5;
      } while (val != 0);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
    } while( true );
  }
LAB_0015a279:
  pxVar6 = (xmlChar *)0x0;
  goto LAB_0015a2ae;
LAB_0015a1fc:
  bVar1 = *local_48;
  uVar7 = (uint)bVar1;
  if (bVar1 == 0x25) {
LAB_0015a21d:
    local_48 = local_48 + 1;
    pxVar6 = xmlParseStringName(ctxt,&local_48);
    if ((pxVar6 == (xmlChar *)0x0) || ((*xmlFree)(pxVar6), *local_48 != 0x3b)) {
      xmlFatalErrMsgInt(ctxt,XML_ERR_ENTITY_CHAR_ERROR,
                        "EntityValue: \'%c\' forbidden except for entities references\n",uVar7);
      pxVar6 = (xmlChar *)0x0;
      goto LAB_0015a2a5;
    }
    if (((uVar7 == 0x25) && (ctxt->inSubset == 1)) && (ctxt->inputNr == 1)) {
      pxVar6 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
      goto LAB_0015a2a5;
    }
  }
  else if (bVar1 == 0x26) {
    if (local_48[1] != 0x23) goto LAB_0015a21d;
  }
  else if (uVar7 == 0) goto LAB_0015a2c9;
  local_48 = local_48 + 1;
  goto LAB_0015a1fc;
LAB_0015a2c9:
  ctxt->depth = ctxt->depth + 1;
  pxVar6 = xmlStringDecodeEntities(ctxt,local_58,2,'\0','\0','\0');
  ctxt->depth = ctxt->depth + -1;
  if (local_38 != (xmlChar **)0x0) {
    *local_38 = local_58;
    return pxVar6;
  }
LAB_0015a2a5:
  if (local_58 == (byte *)0x0) {
    return pxVar6;
  }
LAB_0015a2ae:
  (*xmlFree)(local_58);
  return pxVar6;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int c, l;
    xmlChar stop;
    xmlChar *ret = NULL;
    const xmlChar *cur = NULL;
    xmlParserInputPtr input;

    if (RAW == '"') stop = '"';
    else if (RAW == '\'') stop = '\'';
    else {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }

    /*
     * The content of the entity definition is copied in a buffer.
     */

    ctxt->instate = XML_PARSER_ENTITY_VALUE;
    input = ctxt->input;
    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    NEXT;
    c = CUR_CHAR(l);
    /*
     * NOTE: 4.4.5 Included in Literal
     * When a parameter entity reference appears in a literal entity
     * value, ... a single or double quote character in the replacement
     * text is always treated as a normal data character and will not
     * terminate the literal.
     * In practice it means we stop the loop only when back at parsing
     * the initial entity and the quote is found
     */
    while (((IS_CHAR(c)) && ((c != stop) || /* checked */
	    (ctxt->input != input))) && (ctxt->instate != XML_PARSER_EOF)) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
                goto error;
	    }
	    buf = tmp;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);

	GROW;
	c = CUR_CHAR(l);
	if (c == 0) {
	    GROW;
	    c = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    if (c != stop) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
        goto error;
    }
    NEXT;

    /*
     * Raise problem w.r.t. '&' and '%' being used in non-entities
     * reference constructs. Note Charref will be handled in
     * xmlStringDecodeEntities()
     */
    cur = buf;
    while (*cur != 0) { /* non input consuming */
	if ((*cur == '%') || ((*cur == '&') && (cur[1] != '#'))) {
	    xmlChar *name;
	    xmlChar tmp = *cur;
            int nameOk = 0;

	    cur++;
	    name = xmlParseStringName(ctxt, &cur);
            if (name != NULL) {
                nameOk = 1;
                xmlFree(name);
            }
            if ((nameOk == 0) || (*cur != ';')) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
	    "EntityValue: '%c' forbidden except for entities references\n",
	                          tmp);
                goto error;
	    }
	    if ((tmp == '%') && (ctxt->inSubset == 1) &&
		(ctxt->inputNr == 1)) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                goto error;
	    }
	    if (*cur == 0)
	        break;
	}
	cur++;
    }

    /*
     * Then PEReference entities are substituted.
     *
     * NOTE: 4.4.7 Bypassed
     * When a general entity reference appears in the EntityValue in
     * an entity declaration, it is bypassed and left as is.
     * so XML_SUBSTITUTE_REF is not set here.
     */
    ++ctxt->depth;
    ret = xmlStringDecodeEntities(ctxt, buf, XML_SUBSTITUTE_PEREF,
                                  0, 0, 0);
    --ctxt->depth;
    if (orig != NULL) {
        *orig = buf;
        buf = NULL;
    }

error:
    if (buf != NULL)
        xmlFree(buf);
    return(ret);
}